

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateLdFuncObjProto(Lowerer *this,Instr *instr)

{
  Func *func;
  Opnd *dst;
  Opnd *src;
  LabelInstr *labelReturnTrue;
  LabelInstr *labelReturnNullptr;
  Lowerer *instanceRegOpnd;
  Lowerer *this_00;
  
  func = instr->m_func;
  src = IR::Instr::UnlinkSrc1(instr);
  labelReturnTrue = IR::LabelInstr::New(Label,func,false);
  labelReturnNullptr = IR::LabelInstr::New(Label,func,false);
  instanceRegOpnd = (Lowerer *)IR::RegOpnd::New(TyUint64,func);
  dst = instr->m_dst;
  this_00 = instanceRegOpnd;
  InsertMove((Opnd *)instanceRegOpnd,src,instr,true);
  GenerateRecyclableObjectGetPrototypeNullptrGoto
            (this_00,instr,(RegOpnd *)instanceRegOpnd,labelReturnNullptr);
  InsertMove(dst,(Opnd *)instanceRegOpnd,instr,true);
  GenerateJavascriptOperatorsIsConstructorGotoElse
            (this,instr,(RegOpnd *)instanceRegOpnd,labelReturnTrue,labelReturnNullptr);
  IR::Instr::InsertBefore(instr,&labelReturnNullptr->super_Instr);
  GenerateRuntimeError(this,instr,-0x7ff5ec00,HelperOp_RuntimeTypeError);
  IR::Instr::InsertBefore(instr,&labelReturnTrue->super_Instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::GenerateLdFuncObjProto(IR::Instr* instr)
{
    //  MOV instance, src1
    //
    //  instance = ((RecyclableObject*)instance)->GetPrototype();
    //  if (instance == nullptr) goto $ThrowTypeError;
    //
    //  MOV dst, instance
    //
    //  if (!JavascriptOperators::IsConstructor(instance))
    //     goto $ThrowTypeError;
    //  else
    //     goto $Done;
    //
    //  $helperLabelThrowTypeError:
    //  ThrowRuntimeTypeError(JSERR_NotAConstructor);
    //
    //  $Done:

    Func *func = instr->m_func;
    IR::Opnd *src1Opnd = instr->UnlinkSrc1();

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *helperLabelThrowTypeError = IR::LabelInstr::New(Js::OpCode::Label, func, false);

    IR::RegOpnd *instanceRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    IR::Opnd *dstOpnd = instr->GetDst();

    Lowerer::InsertMove(instanceRegOpnd, src1Opnd, instr);

    this->GenerateRecyclableObjectGetPrototypeNullptrGoto(instr, instanceRegOpnd, helperLabelThrowTypeError);

    Lowerer::InsertMove(dstOpnd, instanceRegOpnd, instr);

    this->GenerateJavascriptOperatorsIsConstructorGotoElse(instr, instanceRegOpnd, labelDone, helperLabelThrowTypeError);

    instr->InsertBefore(helperLabelThrowTypeError);
    this->GenerateRuntimeError(instr, JSERR_NotAConstructor, IR::HelperOp_RuntimeTypeError);

    instr->InsertBefore(labelDone);
    instr->Remove();
}